

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8Texture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmGen8TextureCalc::Fill2DTexOffsetAddress
          (GmmGen8TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint8_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t ArrayQPitch;
  uint32_t i;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen8TextureCalc *this_local;
  
  _ArrayQPitch = pTexInfo;
  pTexInfo_local = (GMM_TEXTURE_INFO *)this;
  if ((((pTexInfo->ArraySize < 2) && (pTexInfo->Type != RESOURCE_CUBE)) &&
      (((ulong)(pTexInfo->Flags).Gpu >> 3 & 1) == 0)) &&
     (((ulong)(pTexInfo->Flags).Gpu >> 4 & 1) == 0)) {
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = 0;
  }
  else {
    GmmTextureCalc::GetCompressionBlockDimensions
              ((GmmTextureCalc *)this,pTexInfo->Format,&local_28,&CompressDepth,&local_2c);
    CompressWidth = (_ArrayQPitch->Alignment).QPitch;
    uVar1 = GmmIsCompressed((this->super_GmmGen7TextureCalc).super_GmmTextureCalc.pGmmLibContext,
                            _ArrayQPitch->Format);
    if (uVar1 == '\0') {
      if (((ulong)(_ArrayQPitch->Flags).Gpu >> 0x1d & 1) == 0) {
        if (((ulong)(_ArrayQPitch->Flags).Gpu >> 1 & 1) != 0) {
          if (((ulong)(_ArrayQPitch->Flags).Gpu >> 0x29 & 1) == 0) {
            if (((ulong)(_ArrayQPitch->Flags).Gpu >> 0x28 & 1) != 0) {
              CompressWidth = CompressWidth >> 4;
            }
          }
          else {
            CompressWidth = CompressWidth >> 5;
          }
        }
      }
      else {
        CompressWidth = CompressWidth >> 1;
      }
    }
    else {
      CompressWidth = CompressWidth / CompressDepth;
    }
    (_ArrayQPitch->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] =
         (ulong)CompressWidth * _ArrayQPitch->Pitch;
    (_ArrayQPitch->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch =
         (ulong)CompressWidth * _ArrayQPitch->Pitch;
  }
  for (CompressHeight = 0; CompressHeight <= _ArrayQPitch->MaxLod;
      CompressHeight = CompressHeight + 1) {
    iVar2 = (*(this->super_GmmGen7TextureCalc).super_GmmTextureCalc._vptr_GmmTextureCalc[8])
                      (this,_ArrayQPitch,(ulong)CompressHeight);
    *(ulong *)(_ArrayQPitch->MmcHint + (ulong)CompressHeight * 8 + 0x80) =
         CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void GmmLib::GmmGen8TextureCalc::Fill2DTexOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t i;

    GMM_DPF_ENTER;

    // QPitch: Array Element-to-Element, or Cube Face-to-Face Pitch...
    if((pTexInfo->ArraySize <= 1) &&
       (pTexInfo->Type != RESOURCE_CUBE) &&
       !(pTexInfo->Flags.Gpu.ColorSeparation ||
         pTexInfo->Flags.Gpu.ColorSeparationRGBX))
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender = 0;
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock   = 0;
    }
    else
    {
        uint32_t ArrayQPitch;
        uint32_t CompressHeight, CompressWidth, CompressDepth;

        GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

        ArrayQPitch = pTexInfo->Alignment.QPitch;

        if(GmmIsCompressed(pGmmLibContext, pTexInfo->Format))
        {
            ArrayQPitch /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            ArrayQPitch /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS)
        {
            if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
            {
                ArrayQPitch /= 32;
            }
            else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
            {
                ArrayQPitch /= 16;
            }
        }

        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender = ArrayQPitch * pTexInfo->Pitch;
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock   = ArrayQPitch * pTexInfo->Pitch;
    }

    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] = Get2DTexOffsetAddressPerMip(pTexInfo, i);
    }

    GMM_DPF_EXIT;
}